

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void VW::clear_seq_and_finish_examples(vw *all,multi_ex *ec_seq)

{
  bool bVar1;
  size_type sVar2;
  reference ppeVar3;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  example *ecc;
  iterator __end2;
  iterator __begin2;
  multi_ex *__range2;
  example *in_stack_ffffffffffffffc8;
  example *in_stack_ffffffffffffffd0;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  
  local_10 = in_RSI;
  sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  if (sVar2 != 0) {
    local_18 = local_10;
    local_20._M_current =
         (example **)
         std::vector<example_*,_std::allocator<example_*>_>::begin
                   ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffc8);
    std::vector<example_*,_std::allocator<example_*>_>::end
              ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      ppeVar3 = __gnu_cxx::
                __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
                operator*(&local_20);
      in_stack_ffffffffffffffd0 = *ppeVar3;
      if ((in_stack_ffffffffffffffd0->in_use & 1U) != 0) {
        finish_example((vw *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
      ::operator++(&local_20);
    }
  }
  std::vector<example_*,_std::allocator<example_*>_>::clear
            ((vector<example_*,_std::allocator<example_*>_> *)0x295ea4);
  return;
}

Assistant:

void clear_seq_and_finish_examples(vw& all, multi_ex& ec_seq)
{
  if (ec_seq.size() > 0)
    for (example* ecc : ec_seq)
      if (ecc->in_use)
        VW::finish_example(all, *ecc);
  ec_seq.clear();
}